

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-wrap.cpp
# Opt level: O0

CommandOptions * write_isxd_file(CommandOptions *Options)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  ui32_t uVar4;
  AESEncContext *this;
  HMACContext *this_00;
  ulong uVar5;
  reference pbVar6;
  uint *puVar7;
  byte_t *pbVar8;
  long in_RSI;
  Result_t *local_978;
  Result_t *local_920;
  Result_t local_8b0 [104];
  UTF16String local_848 [40];
  GenericStreamTextBasedSet *local_820;
  GenericStreamTextBasedSet *text_object;
  undefined1 local_7b0 [8];
  AttributeList doc_attr_list_1;
  string type_name_1;
  string ns_prefix_1;
  string local_6f0 [104];
  string local_688 [8];
  string namespace_name_1;
  FileReader Reader;
  Result_t local_630 [4];
  ui32_t read_count;
  int local_5c4;
  iterator iStack_5c0;
  ui32_t file_size;
  _List_node_base *local_5b8;
  _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5b0;
  iterator i;
  FrameBuffer global_metadata;
  FrameBuffer local_580 [104];
  FrameBuffer local_518 [2];
  Result_t local_4b0 [104];
  uint local_448;
  undefined4 local_444;
  ui32_t duration;
  uint local_43c;
  string local_438 [108];
  int local_3cc;
  undefined1 local_3c8 [8];
  AttributeList doc_attr_list;
  string local_348 [8];
  string namespace_name;
  string type_name;
  string ns_prefix;
  Result_t local_280 [104];
  Result_t local_218 [111];
  FortunaRNG local_1a9;
  undefined1 local_1a8 [7];
  FortunaRNG RNG;
  byte_t IV_buf [16];
  WriterInfo Info;
  Result_t result;
  SequenceParser local_80 [8];
  SequenceParser Parser;
  undefined1 local_60 [8];
  FrameBuffer FrameBuffer;
  MXFWriter Writer;
  HMACContext *HMAC;
  AESEncContext *Context;
  CommandOptions *Options_local;
  
  AS_02::ISXD::MXFWriter::MXFWriter((MXFWriter *)&FrameBuffer.field_0x20);
  ASDCP::DCData::FrameBuffer::FrameBuffer((FrameBuffer *)local_60,*(ui32_t *)(in_RSI + 0x20));
  ASDCP::DCData::SequenceParser::SequenceParser(local_80);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::front((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)(in_RSI + 0x58));
  ASDCP::DCData::SequenceParser::OpenRead((string *)&Info.LabelSetType);
  iVar3 = Kumu::Result_t::operator_cast_to_int((Result_t *)&Info.LabelSetType);
  if ((-1 < iVar3) && ((*(byte *)(in_RSI + 5) & 1) != 0)) {
    fprintf(_stderr,"ISXD Data\n");
    fprintf(_stderr,"Frame Buffer size: %u\n",(ulong)*(uint *)(in_RSI + 0x20));
  }
  iVar3 = Kumu::Result_t::operator_cast_to_int((Result_t *)&Info.LabelSetType);
  if ((-1 < iVar3) && ((*(byte *)(in_RSI + 0xc) & 1) == 0)) {
    ASDCP::WriterInfo::WriterInfo((WriterInfo *)(IV_buf + 8),&s_MyInfo.super_WriterInfo);
    if ((*(byte *)(in_RSI + 2) & 1) == 0) {
      Kumu::GenRandomUUID(Info.ProductUUID + 8);
    }
    else {
      Info.ProductUUID._8_8_ = *(undefined8 *)(in_RSI + 0x45);
      Info.AssetUUID._0_8_ = *(undefined8 *)(in_RSI + 0x4d);
    }
    Info.ProductName.field_2._8_4_ = 2;
    if ((*(byte *)(in_RSI + 1) & 1) != 0) {
      Kumu::FortunaRNG::FortunaRNG(&local_1a9);
      Kumu::GenRandomUUID(Info.AssetUUID + 8);
      Info.CryptographicKeyID[8] = '\x01';
      if ((*(byte *)(in_RSI + 0x34) & 1) == 0) {
        create_random_uuid(Info.ContextID + 8);
      }
      else {
        Info.ContextID._8_8_ = *(undefined8 *)(in_RSI + 0x35);
        Info.CryptographicKeyID._0_8_ = *(undefined8 *)(in_RSI + 0x3d);
      }
      this = (AESEncContext *)operator_new(8);
      ASDCP::AESEncContext::AESEncContext(this);
      ASDCP::AESEncContext::InitKey((uchar *)local_218);
      Kumu::Result_t::operator=((Result_t *)&Info.LabelSetType,local_218);
      Kumu::Result_t::~Result_t(local_218);
      iVar3 = Kumu::Result_t::operator_cast_to_int((Result_t *)&Info.LabelSetType);
      if (-1 < iVar3) {
        Kumu::FortunaRNG::FillRandom((uchar *)&local_1a9,(uint)local_1a8);
        ASDCP::AESEncContext::SetIVec((uchar *)local_280);
        Kumu::Result_t::operator=((Result_t *)&Info.LabelSetType,local_280);
        Kumu::Result_t::~Result_t(local_280);
      }
      iVar3 = Kumu::Result_t::operator_cast_to_int((Result_t *)&Info.LabelSetType);
      if ((-1 < iVar3) && ((*(byte *)(in_RSI + 4) & 1) != 0)) {
        Info.CryptographicKeyID[9] = '\x01';
        this_00 = (HMACContext *)operator_new(8);
        ASDCP::HMACContext::HMACContext(this_00);
        ASDCP::HMACContext::InitKey
                  ((uchar *)(ns_prefix.field_2._M_local_buf + 8),(LabelSet_t)this_00);
        Kumu::Result_t::operator=
                  ((Result_t *)&Info.LabelSetType,(Result_t *)(ns_prefix.field_2._M_local_buf + 8));
        Kumu::Result_t::~Result_t((Result_t *)(ns_prefix.field_2._M_local_buf + 8));
      }
      Kumu::FortunaRNG::~FortunaRNG(&local_1a9);
    }
    iVar3 = Kumu::Result_t::operator_cast_to_int((Result_t *)&Info.LabelSetType);
    if (iVar3 < 0) {
LAB_0011c06f:
      local_3cc = 0;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (in_RSI + 0x218),"auto");
      if (!bVar1) {
LAB_0011bfbc:
        local_43c = 0x4000;
        duration = 1;
        local_444 = 10;
        AS_02::ISXD::MXFWriter::OpenWrite
                  (local_438,(WriterInfo *)&FrameBuffer.field_0x20,(string *)(in_RSI + 0x268),
                   (Rational *)(IV_buf + 8),(uint *)(in_RSI + 0x218),
                   (IndexStrategy_t *)(in_RSI + 0x18),&local_43c);
        Kumu::Result_t::operator=((Result_t *)&Info.LabelSetType,(Result_t *)local_438);
        Kumu::Result_t::~Result_t((Result_t *)local_438);
        goto LAB_0011c06f;
      }
      std::__cxx11::string::string((string *)(type_name.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)(namespace_name.field_2._M_local_buf + 8));
      std::__cxx11::string::string(local_348);
      ASDCP::DCData::SequenceParser::ReadFrame
                ((FrameBuffer *)
                 &doc_attr_list.super__List_base<Kumu::NVPair,_std::allocator<Kumu::NVPair>_>.
                  _M_impl._M_node._M_size);
      Kumu::Result_t::operator=
                ((Result_t *)&Info.LabelSetType,
                 (Result_t *)
                 &doc_attr_list.super__List_base<Kumu::NVPair,_std::allocator<Kumu::NVPair>_>.
                  _M_impl._M_node._M_size);
      Kumu::Result_t::~Result_t
                ((Result_t *)
                 &doc_attr_list.super__List_base<Kumu::NVPair,_std::allocator<Kumu::NVPair>_>.
                  _M_impl._M_node._M_size);
      iVar3 = Kumu::Result_t::operator_cast_to_int((Result_t *)&Info.LabelSetType);
      if (-1 < iVar3) {
        std::__cxx11::list<Kumu::NVPair,_std::allocator<Kumu::NVPair>_>::list
                  ((list<Kumu::NVPair,_std::allocator<Kumu::NVPair>_> *)local_3c8);
        pbVar8 = ASDCP::FrameBuffer::RoData((FrameBuffer *)local_60);
        uVar4 = ASDCP::FrameBuffer::Size((FrameBuffer *)local_60);
        bVar2 = Kumu::GetXMLDocType(pbVar8,uVar4,(string *)(type_name.field_2._M_local_buf + 8),
                                    (string *)(namespace_name.field_2._M_local_buf + 8),local_348,
                                    (list *)local_3c8);
        if ((bVar2 & 1) == 0) {
          local_920 = (Result_t *)Kumu::RESULT_FAIL;
        }
        else {
          local_920 = (Result_t *)Kumu::RESULT_OK;
        }
        Kumu::Result_t::operator=((Result_t *)&Info.LabelSetType,local_920);
        std::__cxx11::list<Kumu::NVPair,_std::allocator<Kumu::NVPair>_>::~list
                  ((list<Kumu::NVPair,_std::allocator<Kumu::NVPair>_> *)local_3c8);
      }
      iVar3 = Kumu::Result_t::operator_cast_to_int((Result_t *)&Info.LabelSetType);
      if ((iVar3 < 0) || (uVar5 = std::__cxx11::string::empty(), (uVar5 & 1) != 0)) {
        fprintf(_stderr,"Unable to parse an XML namespace name from the input document.\n");
        Kumu::Result_t::Result_t((Result_t *)Options,(Result_t *)Kumu::RESULT_FAIL);
        local_3cc = 1;
      }
      else {
        std::__cxx11::string::operator=((string *)(in_RSI + 0x218),local_348);
        local_3cc = 0;
      }
      std::__cxx11::string::~string(local_348);
      std::__cxx11::string::~string((string *)(namespace_name.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(type_name.field_2._M_local_buf + 8));
      if (local_3cc == 0) goto LAB_0011bfbc;
    }
    ASDCP::WriterInfo::~WriterInfo((WriterInfo *)(IV_buf + 8));
    if (local_3cc != 0) goto LAB_0011ca4a;
  }
  iVar3 = Kumu::Result_t::operator_cast_to_int((Result_t *)&Info.LabelSetType);
  if (-1 < iVar3) {
    local_448 = 0;
    ASDCP::DCData::SequenceParser::Reset();
    Kumu::Result_t::operator=((Result_t *)&Info.LabelSetType,local_4b0);
    Kumu::Result_t::~Result_t(local_4b0);
    while( true ) {
      iVar3 = Kumu::Result_t::operator_cast_to_int((Result_t *)&Info.LabelSetType);
      bVar1 = false;
      if (-1 < iVar3) {
        bVar1 = local_448 < *(uint *)(in_RSI + 0x10);
        local_448 = local_448 + 1;
      }
      if (!bVar1) break;
      ASDCP::DCData::SequenceParser::ReadFrame(local_518);
      Kumu::Result_t::operator=((Result_t *)&Info.LabelSetType,(Result_t *)local_518);
      Kumu::Result_t::~Result_t((Result_t *)local_518);
      iVar3 = Kumu::Result_t::operator_cast_to_int((Result_t *)&Info.LabelSetType);
      if (-1 < iVar3) {
        if ((*(byte *)(in_RSI + 5) & 1) != 0) {
          ASDCP::DCData::FrameBuffer::Dump((_IO_FILE *)local_60,(uint)_stderr);
        }
        if ((*(byte *)(in_RSI + 3) & 1) != 0) {
          ASDCP::FrameBuffer::PlaintextOffset((FrameBuffer *)local_60,0);
        }
      }
      iVar3 = Kumu::Result_t::operator_cast_to_int((Result_t *)&Info.LabelSetType);
      if ((-1 < iVar3) && ((*(byte *)(in_RSI + 0xc) & 1) == 0)) {
        AS_02::ISXD::MXFWriter::WriteFrame
                  (local_580,(AESEncContext *)&FrameBuffer.field_0x20,(HMACContext *)local_60);
        Kumu::Result_t::operator=((Result_t *)&Info.LabelSetType,(Result_t *)local_580);
        Kumu::Result_t::~Result_t((Result_t *)local_580);
      }
    }
    bVar1 = Kumu::Result_t::operator==
                      ((Result_t *)&Info.LabelSetType,(Result_t *)Kumu::RESULT_ENDOFFILE);
    if (bVar1) {
      Kumu::Result_t::operator=((Result_t *)&Info.LabelSetType,(Result_t *)Kumu::RESULT_OK);
    }
  }
  iVar3 = Kumu::Result_t::operator_cast_to_int((Result_t *)&Info.LabelSetType);
  if ((-1 < iVar3) && ((*(byte *)(in_RSI + 0xc) & 1) == 0)) {
    ASDCP::FrameBuffer::FrameBuffer((FrameBuffer *)&i);
    std::
    _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_List_iterator(&local_5b0);
    local_5b8 = (_List_node_base *)
                std::__cxx11::
                list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::begin((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(in_RSI + 0x238));
    local_5b0._M_node = local_5b8;
    while( true ) {
      iStack_5c0 = std::__cxx11::
                   list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)(in_RSI + 0x238));
      bVar1 = std::operator!=(&local_5b0,&stack0xfffffffffffffa40);
      if (!bVar1) break;
      pbVar6 = std::
               _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_5b0);
      local_5c4 = Kumu::FileSize((string *)pbVar6);
      ASDCP::FrameBuffer::Capacity((uint)local_630);
      Kumu::Result_t::operator=((Result_t *)&Info.LabelSetType,local_630);
      Kumu::Result_t::~Result_t(local_630);
      iVar3 = Kumu::Result_t::operator_cast_to_int((Result_t *)&Info.LabelSetType);
      if (-1 < iVar3) {
        Kumu::FileReader::FileReader((FileReader *)(namespace_name_1.field_2._M_local_buf + 8));
        std::__cxx11::string::string(local_688);
        std::
        _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator*(&local_5b0);
        Kumu::FileReader::OpenRead(local_6f0);
        Kumu::Result_t::operator=((Result_t *)&Info.LabelSetType,(Result_t *)local_6f0);
        Kumu::Result_t::~Result_t((Result_t *)local_6f0);
        iVar3 = Kumu::Result_t::operator_cast_to_int((Result_t *)&Info.LabelSetType);
        if (-1 < iVar3) {
          puVar7 = (uint *)ASDCP::FrameBuffer::Data((FrameBuffer *)&i);
          Kumu::FileReader::Read
                    ((uchar *)(ns_prefix_1.field_2._M_local_buf + 8),(int)&namespace_name_1 + 0x18,
                     puVar7);
          Kumu::Result_t::operator=
                    ((Result_t *)&Info.LabelSetType,
                     (Result_t *)(ns_prefix_1.field_2._M_local_buf + 8));
          Kumu::Result_t::~Result_t((Result_t *)(ns_prefix_1.field_2._M_local_buf + 8));
        }
        iVar3 = Kumu::Result_t::operator_cast_to_int((Result_t *)&Info.LabelSetType);
        if (iVar3 < 0) {
LAB_0011c780:
          iVar3 = Kumu::Result_t::operator_cast_to_int((Result_t *)&Info.LabelSetType);
          if (-1 < iVar3) {
            AS_02::ISXD::MXFWriter::AddDmsGenericPartUtf8Text
                      ((FrameBuffer *)&text_object,(AESEncContext *)&FrameBuffer.field_0x20,
                       (HMACContext *)&i);
            Kumu::Result_t::operator=((Result_t *)&Info.LabelSetType,(Result_t *)&text_object);
            Kumu::Result_t::~Result_t((Result_t *)&text_object);
          }
          iVar3 = Kumu::Result_t::operator_cast_to_int((Result_t *)&Info.LabelSetType);
          if (-1 < iVar3) {
            local_820 = (GenericStreamTextBasedSet *)0x0;
            get_current_dms_text_descriptor((MXFWriter *)&FrameBuffer.field_0x20,&local_820);
            if (local_820 == (GenericStreamTextBasedSet *)0x0) {
              __assert_fail("text_object",
                            "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/as-02-wrap.cpp"
                            ,0x7c1,"Result_t write_isxd_file(CommandOptions &)");
            }
            ASDCP::MXF::UTF16String::operator=((UTF16String *)(local_820 + 0xe8),"text/xml");
            ASDCP::MXF::UTF16String::UTF16String(local_848,local_688);
            ASDCP::MXF::optional_property<ASDCP::MXF::UTF16String>::operator=
                      ((optional_property<ASDCP::MXF::UTF16String> *)(local_820 + 0x138),local_848);
            ASDCP::MXF::UTF16String::~UTF16String(local_848);
            ASDCP::MXF::UTF16String::operator=
                      ((UTF16String *)(local_820 + 0x110),(string *)(in_RSI + 0x168));
          }
          local_3cc = 0;
        }
        else {
          if (local_5c4 == 0) {
            ASDCP::FrameBuffer::Size((FrameBuffer *)&i,0);
            std::__cxx11::string::string((string *)(type_name_1.field_2._M_local_buf + 8));
            std::__cxx11::string::string
                      ((string *)
                       &doc_attr_list_1.
                        super__List_base<Kumu::NVPair,_std::allocator<Kumu::NVPair>_>._M_impl.
                        _M_node._M_size);
            std::__cxx11::list<Kumu::NVPair,_std::allocator<Kumu::NVPair>_>::list
                      ((list<Kumu::NVPair,_std::allocator<Kumu::NVPair>_> *)local_7b0);
            pbVar8 = ASDCP::FrameBuffer::RoData((FrameBuffer *)&i);
            uVar4 = ASDCP::FrameBuffer::Size((FrameBuffer *)&i);
            bVar2 = Kumu::GetXMLDocType(pbVar8,uVar4,
                                        (string *)(type_name_1.field_2._M_local_buf + 8),
                                        (string *)
                                        &doc_attr_list_1.
                                         super__List_base<Kumu::NVPair,_std::allocator<Kumu::NVPair>_>
                                         ._M_impl._M_node._M_size,local_688,(list *)local_7b0);
            if ((bVar2 & 1) == 0) {
              local_978 = (Result_t *)Kumu::RESULT_FAIL;
            }
            else {
              local_978 = (Result_t *)Kumu::RESULT_OK;
            }
            Kumu::Result_t::operator=((Result_t *)&Info.LabelSetType,local_978);
            std::__cxx11::list<Kumu::NVPair,_std::allocator<Kumu::NVPair>_>::~list
                      ((list<Kumu::NVPair,_std::allocator<Kumu::NVPair>_> *)local_7b0);
            std::__cxx11::string::~string
                      ((string *)
                       &doc_attr_list_1.
                        super__List_base<Kumu::NVPair,_std::allocator<Kumu::NVPair>_>._M_impl.
                        _M_node._M_size);
            std::__cxx11::string::~string((string *)(type_name_1.field_2._M_local_buf + 8));
            goto LAB_0011c780;
          }
          Kumu::Result_t::Result_t((Result_t *)Options,(Result_t *)Kumu::RESULT_READFAIL);
          local_3cc = 1;
        }
        std::__cxx11::string::~string(local_688);
        Kumu::FileReader::~FileReader((FileReader *)(namespace_name_1.field_2._M_local_buf + 8));
        if (local_3cc != 0) goto LAB_0011ca03;
      }
      std::
      _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_5b0);
    }
    iVar3 = Kumu::Result_t::operator_cast_to_int((Result_t *)&Info.LabelSetType);
    if (-1 < iVar3) {
      AS_02::ISXD::MXFWriter::Finalize();
      Kumu::Result_t::operator=((Result_t *)&Info.LabelSetType,local_8b0);
      Kumu::Result_t::~Result_t(local_8b0);
    }
    local_3cc = 0;
LAB_0011ca03:
    ASDCP::FrameBuffer::~FrameBuffer((FrameBuffer *)&i);
    if (local_3cc != 0) goto LAB_0011ca4a;
  }
  Kumu::Result_t::Result_t((Result_t *)Options,(Result_t *)&Info.LabelSetType);
  local_3cc = 1;
LAB_0011ca4a:
  Kumu::Result_t::~Result_t((Result_t *)&Info.LabelSetType);
  ASDCP::DCData::SequenceParser::~SequenceParser(local_80);
  ASDCP::DCData::FrameBuffer::~FrameBuffer((FrameBuffer *)local_60);
  AS_02::ISXD::MXFWriter::~MXFWriter((MXFWriter *)&FrameBuffer.field_0x20);
  return Options;
}

Assistant:

Result_t
write_isxd_file(CommandOptions& Options)
{
  AESEncContext*          Context = 0;
  HMACContext*            HMAC = 0;
  AS_02::ISXD::MXFWriter Writer;
  DCData::FrameBuffer     FrameBuffer(Options.fb_size);
  DCData::SequenceParser  Parser;

  // set up essence parser
  Result_t result = Parser.OpenRead(Options.filenames.front());

  // set up MXF writer
  if ( ASDCP_SUCCESS(result) )
    {

      if ( Options.verbose_flag )
	{
	  fprintf(stderr, "ISXD Data\n");
	  fprintf(stderr, "Frame Buffer size: %u\n", Options.fb_size);
	}
    }

  if ( ASDCP_SUCCESS(result) && ! Options.no_write_flag )
  {
    WriterInfo Info = s_MyInfo;  // fill in your favorite identifiers here
    if ( Options.asset_id_flag )
      memcpy(Info.AssetUUID, Options.asset_id_value, UUIDlen);
    else
      Kumu::GenRandomUUID(Info.AssetUUID);

    Info.LabelSetType = LS_MXF_SMPTE;

#ifdef HAVE_OPENSSL
      // configure encryption
    if( Options.key_flag )
	{
      byte_t                  IV_buf[CBC_BLOCK_SIZE];
      Kumu::FortunaRNG        RNG;
	  Kumu::GenRandomUUID(Info.ContextID);
	  Info.EncryptedEssence = true;

	  if ( Options.key_id_flag )
	    {
	      memcpy(Info.CryptographicKeyID, Options.key_id_value, UUIDlen);
	    }
	  else
	    {
	      create_random_uuid(Info.CryptographicKeyID);
	    }

	  Context = new AESEncContext;
	  result = Context->InitKey(Options.key_value);

	  if ( ASDCP_SUCCESS(result) )
	    result = Context->SetIVec(RNG.FillRandom(IV_buf, CBC_BLOCK_SIZE));

	  if ( ASDCP_SUCCESS(result) && Options.write_hmac )
      {
        Info.UsesHMAC = true;
        HMAC = new HMACContext;
        result = HMAC->InitKey(Options.key_value, Info.LabelSetType);
      }
	}
#endif // HAVE_OPENSSL

    if ( ASDCP_SUCCESS(result) )
      {
	if ( Options.isxd_document_namespace == "auto" )
	  {
	    // get ns of first item
	    std::string ns_prefix, type_name, namespace_name;
	    result = Parser.ReadFrame(FrameBuffer);

	    if ( ASDCP_SUCCESS(result) )
	      {
		Kumu::AttributeList doc_attr_list;
		result = GetXMLDocType(FrameBuffer.RoData(), FrameBuffer.Size(), ns_prefix, type_name,
				       namespace_name, doc_attr_list) ? RESULT_OK : RESULT_FAIL;
	      }

	    if ( ASDCP_SUCCESS(result) && ! namespace_name.empty() )
	      {
		Options.isxd_document_namespace = namespace_name;
	      }
	    else
	      {
		fprintf(stderr, "Unable to parse an XML namespace name from the input document.\n");
		return RESULT_FAIL;
	      }
	  }

	result = Writer.OpenWrite(Options.out_file, Info, Options.isxd_document_namespace, Options.edit_rate);
      }
  }

  if ( ASDCP_SUCCESS(result) )
    {
      ui32_t duration = 0;
      result = Parser.Reset();

      while ( ASDCP_SUCCESS(result) && duration++ < Options.duration )
	{
	  result = Parser.ReadFrame(FrameBuffer);

	  if ( ASDCP_SUCCESS(result) )
	    {
	      if ( Options.verbose_flag )
		FrameBuffer.Dump(stderr, Options.fb_dump_size);

	      if ( Options.encrypt_header_flag )
		FrameBuffer.PlaintextOffset(0);
	    }

	  if ( ASDCP_SUCCESS(result) && ! Options.no_write_flag )
	    {
	      result = Writer.WriteFrame(FrameBuffer, Context, HMAC);

	      // The Writer class will forward the last block of ciphertext
	      // to the encryption context for use as the IV for the next
	      // frame. If you want to use non-sequitur IV values, un-comment
	      // the following  line of code.
	      // if ( ASDCP_SUCCESS(result) && Options.key_flag )
	      //   Context->SetIVec(RNG.FillRandom(IV_buf, CBC_BLOCK_SIZE));
	    }
	}

      if ( result == RESULT_ENDOFFILE )
	{
	  result = RESULT_OK;
	}
    }
  
  if ( KM_SUCCESS(result) && ! Options.no_write_flag )
    {
      ASDCP::FrameBuffer global_metadata;
      std::list<std::string>::iterator i;
      
      for ( i = Options.global_isxd_metadata.begin(); i != Options.global_isxd_metadata.end(); ++i )
	{
	  ui32_t file_size = Kumu::FileSize(*i);
	  result = global_metadata.Capacity(file_size);

	  if ( KM_SUCCESS(result) )
	    {
	      ui32_t read_count = 0;
	      Kumu::FileReader Reader;
	      std::string namespace_name;

	      result = Reader.OpenRead(*i);

	      if ( KM_SUCCESS(result) )
		{
		  result = Reader.Read(global_metadata.Data(), file_size, &read_count);
		}

	      if ( KM_SUCCESS(result) )
		{
		  if ( file_size != read_count) 
		    return RESULT_READFAIL;

		  global_metadata.Size(read_count);
		  std::string ns_prefix, type_name;
		  Kumu::AttributeList doc_attr_list;
		  result = GetXMLDocType(global_metadata.RoData(), global_metadata.Size(), ns_prefix, type_name,
					 namespace_name, doc_attr_list) ? RESULT_OK : RESULT_FAIL;
		}

	      if ( KM_SUCCESS(result) )
		{
		  result = Writer.AddDmsGenericPartUtf8Text(global_metadata, Context, HMAC);
		}

	      if ( KM_SUCCESS(result) )
		{
		  ASDCP::MXF::GenericStreamTextBasedSet *text_object = 0;
		  get_current_dms_text_descriptor(Writer, text_object);
		  assert(text_object);
		  text_object->TextMIMEMediaType = "text/xml";
		  text_object->TextDataDescription = namespace_name;

		  // this is not really useful when inserting multiple objects because
		  // it cannot be set per object without some other CLI syntax for
		  // associating language codes with 2057 blobs, e.g., <filename>:<lang>
		  text_object->RFC5646TextLanguageCode = Options.language;
		}
	    }
	}

      if ( KM_SUCCESS(result) )
	{
	  result = Writer.Finalize();
	}
    }

  return result;
}